

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O1

void __thiscall
google::protobuf::util::anon_unknown_0::FieldMaskTree::MergeMessage
          (FieldMaskTree *this,Node *node,Message *source,MergeOptions *options,Message *destination
          )

{
  _Rb_tree_node_base *key;
  FieldMaskTree *this_00;
  Reflection *this_01;
  bool bVar1;
  int32 iVar2;
  int iVar3;
  uint32 uVar4;
  uint uVar5;
  LogMessage *pLVar6;
  FieldDescriptor *field;
  Node *pNVar7;
  MergeOptions *options_00;
  _Base_ptr p_Var8;
  Message *pMVar9;
  Message *pMVar10;
  uint64 uVar11;
  EnumValueDescriptor *pEVar12;
  int64 iVar13;
  Reflection *extraout_RDX;
  Reflection *extraout_RDX_00;
  int iVar14;
  uint uVar15;
  float fVar16;
  double dVar17;
  LogMessage local_120;
  string local_e8;
  string local_c8;
  code *local_a8 [7];
  _Rb_tree_node_base *local_70;
  Descriptor *local_68;
  Message *local_60;
  FieldDescriptor *local_58;
  Node *local_50;
  Reflection *local_48;
  Reflection *local_40;
  MergeOptions *local_38;
  
  local_60 = source;
  local_38 = options;
  if ((this->root_).children._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    protobuf::internal::LogMessage::LogMessage
              (&local_120,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/util/field_mask_util.cc"
               ,0x1c5);
    pLVar6 = protobuf::internal::LogMessage::operator<<
                       (&local_120,"CHECK failed: !node->children.empty(): ");
    protobuf::internal::LogFinisher::operator=((LogFinisher *)local_a8,pLVar6);
    protobuf::internal::LogMessage::~LogMessage(&local_120);
  }
  (**(code **)(*(long *)&(node->children)._M_t._M_impl + 0x98))(node);
  local_48 = extraout_RDX;
  (**(code **)(*(long *)local_38 + 0x98))();
  local_50 = node;
  local_40 = extraout_RDX_00;
  local_68 = (Descriptor *)(**(code **)(*(long *)&(node->children)._M_t._M_impl + 0x98))(node);
  p_Var8 = (this->root_).children._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_70 = &(this->root_).children._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var8 != local_70) {
    do {
      key = p_Var8 + 1;
      this_00 = *(FieldMaskTree **)(p_Var8 + 2);
      field = Descriptor::FindFieldByName(local_68,(string *)key);
      if (field == (FieldDescriptor *)0x0) {
        protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_a8,LOGLEVEL_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/util/field_mask_util.cc"
                   ,0x1cf);
        pLVar6 = protobuf::internal::LogMessage::operator<<
                           ((LogMessage *)local_a8,"Cannot find field \"");
        pLVar6 = protobuf::internal::LogMessage::operator<<(pLVar6,(string *)key);
        pLVar6 = protobuf::internal::LogMessage::operator<<(pLVar6,"\" in message ");
        pLVar6 = protobuf::internal::LogMessage::operator<<(pLVar6,*(string **)(local_68 + 8));
        protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_58,pLVar6);
LAB_0030c40f:
        protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_a8);
      }
      else {
        if ((this_00->root_).children._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          if (*(int *)(field + 0x3c) != 3) {
            if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
              local_a8[0] = FieldDescriptor::TypeOnceInit;
              local_58 = field;
              std::
              call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                        (*(once_flag **)(field + 0x30),local_a8,&local_58);
            }
            if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) ==
                10) {
              pNVar7 = (Node *)Reflection::GetMessage
                                         (local_48,(Message *)local_50,field,(MessageFactory *)0x0);
              options_00 = (MergeOptions *)
                           Reflection::MutableMessage
                                     (local_40,(Message *)local_38,field,(MessageFactory *)0x0);
              MergeMessage(this_00,pNVar7,local_60,options_00,destination);
              goto switchD_0030c4a5_default;
            }
          }
          protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_a8,LOGLEVEL_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/util/field_mask_util.cc"
                     ,0x1d7);
          pLVar6 = protobuf::internal::LogMessage::operator<<((LogMessage *)local_a8,"Field \"");
          pLVar6 = protobuf::internal::LogMessage::operator<<(pLVar6,(string *)key);
          pLVar6 = protobuf::internal::LogMessage::operator<<(pLVar6,"\" in message ");
          pLVar6 = protobuf::internal::LogMessage::operator<<(pLVar6,*(string **)(local_68 + 8));
          pLVar6 = protobuf::internal::LogMessage::operator<<
                             (pLVar6," is not a singular message field and cannot ");
          pLVar6 = protobuf::internal::LogMessage::operator<<(pLVar6,"have sub-fields.");
          protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_58,pLVar6);
          goto LAB_0030c40f;
        }
        if (*(int *)(field + 0x3c) == 3) {
          if (*(char *)((long)&(local_60->super_MessageLite)._vptr_MessageLite + 1) == '\x01') {
            Reflection::ClearField(local_40,(Message *)local_38,field);
          }
          if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
            local_a8[0] = FieldDescriptor::TypeOnceInit;
            local_58 = field;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (*(once_flag **)(field + 0x30),local_a8,&local_58);
          }
          switch(*(undefined4 *)
                  (FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4)) {
          case 1:
            iVar3 = Reflection::FieldSize(local_48,(Message *)local_50,field);
            if (0 < iVar3) {
              iVar14 = 0;
              do {
                iVar2 = Reflection::GetRepeatedInt32(local_48,(Message *)local_50,field,iVar14);
                Reflection::AddInt32(local_40,(Message *)local_38,field,iVar2);
                iVar14 = iVar14 + 1;
              } while (iVar3 != iVar14);
            }
            break;
          case 2:
            iVar3 = Reflection::FieldSize(local_48,(Message *)local_50,field);
            if (0 < iVar3) {
              iVar14 = 0;
              do {
                iVar13 = Reflection::GetRepeatedInt64(local_48,(Message *)local_50,field,iVar14);
                Reflection::AddInt64(local_40,(Message *)local_38,field,iVar13);
                iVar14 = iVar14 + 1;
              } while (iVar3 != iVar14);
            }
            break;
          case 3:
            iVar3 = Reflection::FieldSize(local_48,(Message *)local_50,field);
            if (0 < iVar3) {
              iVar14 = 0;
              do {
                uVar4 = Reflection::GetRepeatedUInt32(local_48,(Message *)local_50,field,iVar14);
                Reflection::AddUInt32(local_40,(Message *)local_38,field,uVar4);
                iVar14 = iVar14 + 1;
              } while (iVar3 != iVar14);
            }
            break;
          case 4:
            iVar3 = Reflection::FieldSize(local_48,(Message *)local_50,field);
            if (0 < iVar3) {
              iVar14 = 0;
              do {
                uVar11 = Reflection::GetRepeatedUInt64(local_48,(Message *)local_50,field,iVar14);
                Reflection::AddUInt64(local_40,(Message *)local_38,field,uVar11);
                iVar14 = iVar14 + 1;
              } while (iVar3 != iVar14);
            }
            break;
          case 5:
            iVar3 = Reflection::FieldSize(local_48,(Message *)local_50,field);
            if (0 < iVar3) {
              iVar14 = 0;
              do {
                dVar17 = Reflection::GetRepeatedDouble(local_48,(Message *)local_50,field,iVar14);
                Reflection::AddDouble(local_40,(Message *)local_38,field,dVar17);
                iVar14 = iVar14 + 1;
              } while (iVar3 != iVar14);
            }
            break;
          case 6:
            iVar3 = Reflection::FieldSize(local_48,(Message *)local_50,field);
            if (0 < iVar3) {
              iVar14 = 0;
              do {
                fVar16 = Reflection::GetRepeatedFloat(local_48,(Message *)local_50,field,iVar14);
                Reflection::AddFloat(local_40,(Message *)local_38,field,fVar16);
                iVar14 = iVar14 + 1;
              } while (iVar3 != iVar14);
            }
            break;
          case 7:
            iVar3 = Reflection::FieldSize(local_48,(Message *)local_50,field);
            if (0 < iVar3) {
              iVar14 = 0;
              do {
                bVar1 = Reflection::GetRepeatedBool(local_48,(Message *)local_50,field,iVar14);
                Reflection::AddBool(local_40,(Message *)local_38,field,bVar1);
                iVar14 = iVar14 + 1;
              } while (iVar3 != iVar14);
            }
            break;
          case 8:
            iVar3 = Reflection::FieldSize(local_48,(Message *)local_50,field);
            if (0 < iVar3) {
              iVar14 = 0;
              do {
                pEVar12 = Reflection::GetRepeatedEnum(local_48,(Message *)local_50,field,iVar14);
                Reflection::AddEnum(local_40,(Message *)local_38,field,pEVar12);
                iVar14 = iVar14 + 1;
              } while (iVar3 != iVar14);
            }
            break;
          case 9:
            uVar5 = Reflection::FieldSize(local_48,(Message *)local_50,field);
            if (0 < (int)uVar5) {
              pMVar9 = (Message *)0x0;
              do {
                destination = pMVar9;
                iVar3 = (int)destination;
                Reflection::GetRepeatedString_abi_cxx11_
                          (&local_c8,local_48,(Message *)local_50,field,iVar3);
                Reflection::AddString(local_40,(Message *)local_38,field,&local_c8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                  operator_delete(local_c8._M_dataplus._M_p);
                }
                uVar15 = iVar3 + 1;
                pMVar9 = (Message *)(ulong)uVar15;
              } while (uVar5 != uVar15);
            }
            break;
          case 10:
            iVar3 = Reflection::FieldSize(local_48,(Message *)local_50,field);
            if (0 < iVar3) {
              iVar14 = 0;
              do {
                pMVar9 = Reflection::AddMessage
                                   (local_40,(Message *)local_38,field,(MessageFactory *)0x0);
                pMVar10 = Reflection::GetRepeatedMessage(local_48,(Message *)local_50,field,iVar14);
                (*(pMVar9->super_MessageLite)._vptr_MessageLite[0xf])(pMVar9,pMVar10);
                iVar14 = iVar14 + 1;
              } while (iVar3 != iVar14);
            }
          }
        }
        else {
          if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
            local_a8[0] = FieldDescriptor::TypeOnceInit;
            local_58 = field;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (*(once_flag **)(field + 0x30),local_a8,&local_58);
          }
          this_01 = local_48;
          pNVar7 = local_50;
          switch(*(undefined4 *)
                  (FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4)) {
          case 1:
            bVar1 = Reflection::HasField(local_48,(Message *)local_50,field);
            if (bVar1) {
              iVar2 = Reflection::GetInt32(this_01,(Message *)pNVar7,field);
              Reflection::SetInt32(local_40,(Message *)local_38,field,iVar2);
            }
            else {
LAB_0030cb39:
              Reflection::ClearField(local_40,(Message *)local_38,field);
            }
            break;
          case 2:
            bVar1 = Reflection::HasField(local_48,(Message *)local_50,field);
            if (!bVar1) goto LAB_0030cb39;
            iVar13 = Reflection::GetInt64(this_01,(Message *)pNVar7,field);
            Reflection::SetInt64(local_40,(Message *)local_38,field,iVar13);
            break;
          case 3:
            bVar1 = Reflection::HasField(local_48,(Message *)local_50,field);
            if (!bVar1) goto LAB_0030cb39;
            uVar4 = Reflection::GetUInt32(this_01,(Message *)pNVar7,field);
            Reflection::SetUInt32(local_40,(Message *)local_38,field,uVar4);
            break;
          case 4:
            bVar1 = Reflection::HasField(local_48,(Message *)local_50,field);
            if (!bVar1) goto LAB_0030cb39;
            uVar11 = Reflection::GetUInt64(this_01,(Message *)pNVar7,field);
            Reflection::SetUInt64(local_40,(Message *)local_38,field,uVar11);
            break;
          case 5:
            bVar1 = Reflection::HasField(local_48,(Message *)local_50,field);
            if (!bVar1) goto LAB_0030cb39;
            dVar17 = Reflection::GetDouble(this_01,(Message *)pNVar7,field);
            Reflection::SetDouble(local_40,(Message *)local_38,field,dVar17);
            break;
          case 6:
            bVar1 = Reflection::HasField(local_48,(Message *)local_50,field);
            if (!bVar1) goto LAB_0030cb39;
            fVar16 = Reflection::GetFloat(this_01,(Message *)pNVar7,field);
            Reflection::SetFloat(local_40,(Message *)local_38,field,fVar16);
            break;
          case 7:
            bVar1 = Reflection::HasField(local_48,(Message *)local_50,field);
            if (!bVar1) goto LAB_0030cb39;
            bVar1 = Reflection::GetBool(this_01,(Message *)pNVar7,field);
            Reflection::SetBool(local_40,(Message *)local_38,field,bVar1);
            break;
          case 8:
            bVar1 = Reflection::HasField(local_48,(Message *)local_50,field);
            if (!bVar1) goto LAB_0030cb39;
            pEVar12 = Reflection::GetEnum(this_01,(Message *)pNVar7,field);
            Reflection::SetEnum(local_40,(Message *)local_38,field,pEVar12);
            break;
          case 9:
            bVar1 = Reflection::HasField(local_48,(Message *)local_50,field);
            if (!bVar1) goto LAB_0030cb39;
            Reflection::GetString_abi_cxx11_(&local_e8,this_01,(Message *)pNVar7,field);
            Reflection::SetString(local_40,(Message *)local_38,field,&local_e8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p);
            }
            break;
          case 10:
            if (*(char *)&(local_60->super_MessageLite)._vptr_MessageLite == '\x01') {
              Reflection::ClearField(local_40,(Message *)local_38,field);
            }
            bVar1 = Reflection::HasField(this_01,(Message *)pNVar7,field);
            if (bVar1) {
              pMVar9 = Reflection::MutableMessage
                                 (local_40,(Message *)local_38,field,(MessageFactory *)0x0);
              pMVar10 = Reflection::GetMessage
                                  (local_48,(Message *)local_50,field,(MessageFactory *)0x0);
              (*(pMVar9->super_MessageLite)._vptr_MessageLite[0xf])(pMVar9,pMVar10);
            }
          }
        }
      }
switchD_0030c4a5_default:
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while (p_Var8 != local_70);
  }
  return;
}

Assistant:

void FieldMaskTree::MergeMessage(const Node* node, const Message& source,
                                 const FieldMaskUtil::MergeOptions& options,
                                 Message* destination) {
  GOOGLE_DCHECK(!node->children.empty());
  const Reflection* source_reflection = source.GetReflection();
  const Reflection* destination_reflection = destination->GetReflection();
  const Descriptor* descriptor = source.GetDescriptor();
  for (std::map<std::string, Node*>::const_iterator it = node->children.begin();
       it != node->children.end(); ++it) {
    const std::string& field_name = it->first;
    const Node* child = it->second;
    const FieldDescriptor* field = descriptor->FindFieldByName(field_name);
    if (field == NULL) {
      GOOGLE_LOG(ERROR) << "Cannot find field \"" << field_name << "\" in message "
                 << descriptor->full_name();
      continue;
    }
    if (!child->children.empty()) {
      // Sub-paths are only allowed for singular message fields.
      if (field->is_repeated() ||
          field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
        GOOGLE_LOG(ERROR) << "Field \"" << field_name << "\" in message "
                   << descriptor->full_name()
                   << " is not a singular message field and cannot "
                   << "have sub-fields.";
        continue;
      }
      MergeMessage(child, source_reflection->GetMessage(source, field), options,
                   destination_reflection->MutableMessage(destination, field));
      continue;
    }
    if (!field->is_repeated()) {
      switch (field->cpp_type()) {
#define COPY_VALUE(TYPE, Name)                                              \
  case FieldDescriptor::CPPTYPE_##TYPE: {                                   \
    if (source_reflection->HasField(source, field)) {                       \
      destination_reflection->Set##Name(                                    \
          destination, field, source_reflection->Get##Name(source, field)); \
    } else {                                                                \
      destination_reflection->ClearField(destination, field);               \
    }                                                                       \
    break;                                                                  \
  }
        COPY_VALUE(BOOL, Bool)
        COPY_VALUE(INT32, Int32)
        COPY_VALUE(INT64, Int64)
        COPY_VALUE(UINT32, UInt32)
        COPY_VALUE(UINT64, UInt64)
        COPY_VALUE(FLOAT, Float)
        COPY_VALUE(DOUBLE, Double)
        COPY_VALUE(ENUM, Enum)
        COPY_VALUE(STRING, String)
#undef COPY_VALUE
        case FieldDescriptor::CPPTYPE_MESSAGE: {
          if (options.replace_message_fields()) {
            destination_reflection->ClearField(destination, field);
          }
          if (source_reflection->HasField(source, field)) {
            destination_reflection->MutableMessage(destination, field)
                ->MergeFrom(source_reflection->GetMessage(source, field));
          }
          break;
        }
      }
    } else {
      if (options.replace_repeated_fields()) {
        destination_reflection->ClearField(destination, field);
      }
      switch (field->cpp_type()) {
#define COPY_REPEATED_VALUE(TYPE, Name)                            \
  case FieldDescriptor::CPPTYPE_##TYPE: {                          \
    int size = source_reflection->FieldSize(source, field);        \
    for (int i = 0; i < size; ++i) {                               \
      destination_reflection->Add##Name(                           \
          destination, field,                                      \
          source_reflection->GetRepeated##Name(source, field, i)); \
    }                                                              \
    break;                                                         \
  }
        COPY_REPEATED_VALUE(BOOL, Bool)
        COPY_REPEATED_VALUE(INT32, Int32)
        COPY_REPEATED_VALUE(INT64, Int64)
        COPY_REPEATED_VALUE(UINT32, UInt32)
        COPY_REPEATED_VALUE(UINT64, UInt64)
        COPY_REPEATED_VALUE(FLOAT, Float)
        COPY_REPEATED_VALUE(DOUBLE, Double)
        COPY_REPEATED_VALUE(ENUM, Enum)
        COPY_REPEATED_VALUE(STRING, String)
#undef COPY_REPEATED_VALUE
        case FieldDescriptor::CPPTYPE_MESSAGE: {
          int size = source_reflection->FieldSize(source, field);
          for (int i = 0; i < size; ++i) {
            destination_reflection->AddMessage(destination, field)
                ->MergeFrom(
                    source_reflection->GetRepeatedMessage(source, field, i));
          }
          break;
        }
      }
    }
  }
}